

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.pb.cc
# Opt level: O1

uint8 * __thiscall
bloaty::Options::InternalSerializeWithCachedSizesToArray
          (Options *this,uint8 *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  string *psVar5;
  void *pvVar6;
  Type *pTVar7;
  ulong uVar8;
  Type *this_00;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  uint8 *puVar13;
  uint8 *puVar14;
  
  iVar2 = (this->filename_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    iVar12 = 0;
    do {
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->filename_).super_RepeatedPtrFieldBase,iVar12);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((pTVar7->_M_dataplus)._M_p,(int)pTVar7->_M_string_length,SERIALIZE,
                 "bloaty.Options.filename");
      sVar4 = pTVar7->_M_string_length;
      if (((long)sVar4 < 0x80) && ((long)sVar4 <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = '\n';
        target[1] = (uint8)sVar4;
        memcpy(target + 2,(pTVar7->_M_dataplus)._M_p,sVar4);
        target = target + sVar4 + 2;
      }
      else {
        target = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           (stream,1,pTVar7,target);
      }
      iVar12 = iVar12 + 1;
    } while (iVar2 != iVar12);
  }
  iVar2 = (this->base_filename_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    iVar12 = 0;
    do {
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->base_filename_).super_RepeatedPtrFieldBase,iVar12);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((pTVar7->_M_dataplus)._M_p,(int)pTVar7->_M_string_length,SERIALIZE,
                 "bloaty.Options.base_filename");
      sVar4 = pTVar7->_M_string_length;
      if (((long)sVar4 < 0x80) && ((long)sVar4 <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = '\x12';
        target[1] = (uint8)sVar4;
        memcpy(target + 2,(pTVar7->_M_dataplus)._M_p,sVar4);
        target = target + sVar4 + 2;
      }
      else {
        target = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           (stream,2,pTVar7,target);
      }
      iVar12 = iVar12 + 1;
    } while (iVar2 != iVar12);
  }
  iVar2 = (this->data_source_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    iVar12 = 0;
    do {
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->data_source_).super_RepeatedPtrFieldBase,iVar12);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((pTVar7->_M_dataplus)._M_p,(int)pTVar7->_M_string_length,SERIALIZE,
                 "bloaty.Options.data_source");
      sVar4 = pTVar7->_M_string_length;
      if (((long)sVar4 < 0x80) && ((long)sVar4 <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = '\x1a';
        target[1] = (uint8)sVar4;
        memcpy(target + 2,(pTVar7->_M_dataplus)._M_p,sVar4);
        target = target + sVar4 + 2;
      }
      else {
        target = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           (stream,3,pTVar7,target);
      }
      iVar12 = iVar12 + 1;
    } while (iVar2 != iVar12);
  }
  uVar3 = (this->_has_bits_).has_bits_[0];
  if ((uVar3 >> 8 & 1) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar8 = this->max_rows_per_level_;
    *target = ' ';
    if (uVar8 < 0x80) {
      target[1] = (byte)uVar8;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar8 | 0x80;
      if (uVar8 < 0x4000) {
        target[2] = (uint8)(uVar8 >> 7);
        target = target + 3;
      }
      else {
        uVar8 = uVar8 >> 7;
        target = target + 3;
        do {
          puVar13 = target;
          puVar13[-1] = (byte)uVar8 | 0x80;
          uVar9 = uVar8 >> 7;
          target = puVar13 + 1;
          bVar1 = 0x3fff < uVar8;
          uVar8 = uVar9;
        } while (bVar1);
        *puVar13 = (uint8)uVar9;
      }
    }
  }
  if ((uVar3 & 4) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar10 = this->demangle_;
    *target = '(';
    if ((ulong)(long)(int)uVar10 < 0x80) {
      target[1] = (byte)uVar10;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar10 | 0x80;
      uVar8 = (ulong)(long)(int)uVar10 >> 7;
      if (uVar10 < 0x4000) {
        target[2] = (uint8)uVar8;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar13 = target;
          puVar13[-1] = (byte)uVar8 | 0x80;
          uVar9 = uVar8 >> 7;
          target = puVar13 + 1;
          bVar1 = 0x3fff < uVar8;
          uVar8 = uVar9;
        } while (bVar1);
        *puVar13 = (uint8)uVar9;
      }
    }
  }
  if ((uVar3 & 8) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar10 = this->sort_by_;
    *target = '0';
    if ((ulong)(long)(int)uVar10 < 0x80) {
      target[1] = (byte)uVar10;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar10 | 0x80;
      uVar8 = (ulong)(long)(int)uVar10 >> 7;
      if (uVar10 < 0x4000) {
        target[2] = (uint8)uVar8;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar13 = target;
          puVar13[-1] = (byte)uVar8 | 0x80;
          uVar9 = uVar8 >> 7;
          target = puVar13 + 1;
          bVar1 = 0x3fff < uVar8;
          uVar8 = uVar9;
        } while (bVar1);
        *puVar13 = (uint8)uVar9;
      }
    }
  }
  if ((uVar3 & 0x10) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar10 = this->verbose_level_;
    *target = '8';
    if ((ulong)(long)(int)uVar10 < 0x80) {
      target[1] = (byte)uVar10;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar10 | 0x80;
      uVar8 = (ulong)(long)(int)uVar10 >> 7;
      if (uVar10 < 0x4000) {
        target[2] = (uint8)uVar8;
        target = target + 3;
      }
      else {
        target = target + 3;
        do {
          puVar13 = target;
          puVar13[-1] = (byte)uVar8 | 0x80;
          uVar9 = uVar8 >> 7;
          target = puVar13 + 1;
          bVar1 = 0x3fff < uVar8;
          uVar8 = uVar9;
        } while (bVar1);
        *puVar13 = (uint8)uVar9;
      }
    }
  }
  iVar2 = (this->custom_data_source_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar2 != 0) {
    iVar12 = 0;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<bloaty::CustomDataSource>::TypeHandler>
                          (&(this->custom_data_source_).super_RepeatedPtrFieldBase,iVar12);
      *target = 'B';
      uVar10 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar10 < 0x80) {
        target[1] = (byte)uVar10;
        puVar13 = target + 2;
      }
      else {
        target[1] = (byte)uVar10 | 0x80;
        if (uVar10 < 0x4000) {
          target[2] = (uint8)(uVar10 >> 7);
          puVar13 = target + 3;
        }
        else {
          puVar13 = target + 3;
          uVar10 = uVar10 >> 7;
          do {
            puVar14 = puVar13;
            puVar14[-1] = (byte)uVar10 | 0x80;
            uVar11 = uVar10 >> 7;
            puVar13 = puVar14 + 1;
            bVar1 = 0x3fff < uVar10;
            uVar10 = uVar11;
          } while (bVar1);
          *puVar14 = (uint8)uVar11;
        }
      }
      target = CustomDataSource::InternalSerializeWithCachedSizesToArray(this_00,puVar13,stream);
      iVar12 = iVar12 + 1;
    } while (iVar12 != iVar2);
  }
  if ((uVar3 & 1) != 0) {
    psVar5 = (this->disassemble_function_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar5->_M_dataplus)._M_p,(int)psVar5->_M_string_length,SERIALIZE,
               "bloaty.Options.disassemble_function");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,9,(this->disassemble_function_).ptr_,target);
  }
  iVar2 = (this->debug_filename_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    iVar12 = 0;
    do {
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->debug_filename_).super_RepeatedPtrFieldBase,iVar12);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((pTVar7->_M_dataplus)._M_p,(int)pTVar7->_M_string_length,SERIALIZE,
                 "bloaty.Options.debug_filename");
      sVar4 = pTVar7->_M_string_length;
      if (((long)sVar4 < 0x80) && ((long)sVar4 <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = 'R';
        target[1] = (uint8)sVar4;
        memcpy(target + 2,(pTVar7->_M_dataplus)._M_p,sVar4);
        target = target + sVar4 + 2;
      }
      else {
        target = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           (stream,10,pTVar7,target);
      }
      iVar12 = iVar12 + 1;
    } while (iVar2 != iVar12);
  }
  if ((uVar3 & 0x40) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar8 = this->debug_vmaddr_;
    *target = 'X';
    if (uVar8 < 0x80) {
      target[1] = (byte)uVar8;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar8 | 0x80;
      if (uVar8 < 0x4000) {
        target[2] = (uint8)(uVar8 >> 7);
        target = target + 3;
      }
      else {
        uVar8 = uVar8 >> 7;
        target = target + 3;
        do {
          puVar13 = target;
          puVar13[-1] = (byte)uVar8 | 0x80;
          uVar9 = uVar8 >> 7;
          target = puVar13 + 1;
          bVar1 = 0x3fff < uVar8;
          uVar8 = uVar9;
        } while (bVar1);
        *puVar13 = (uint8)uVar9;
      }
    }
  }
  if ((char)uVar3 < '\0') {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar8 = this->debug_fileoff_;
    *target = '`';
    if (uVar8 < 0x80) {
      target[1] = (byte)uVar8;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar8 | 0x80;
      if (uVar8 < 0x4000) {
        target[2] = (uint8)(uVar8 >> 7);
        target = target + 3;
      }
      else {
        uVar8 = uVar8 >> 7;
        target = target + 3;
        do {
          puVar13 = target;
          puVar13[-1] = (byte)uVar8 | 0x80;
          uVar9 = uVar8 >> 7;
          target = puVar13 + 1;
          bVar1 = 0x3fff < uVar8;
          uVar8 = uVar9;
        } while (bVar1);
        *puVar13 = (uint8)uVar9;
      }
    }
  }
  if ((uVar3 & 2) != 0) {
    psVar5 = (this->source_filter_).ptr_;
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar5->_M_dataplus)._M_p,(int)psVar5->_M_string_length,SERIALIZE,
               "bloaty.Options.source_filter");
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,0xd,(this->source_filter_).ptr_,target);
  }
  if ((uVar3 & 0x20) != 0) {
    if (stream->end_ <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    bVar1 = this->dump_raw_map_;
    *target = 'p';
    target[1] = bVar1;
    target = target + 2;
  }
  iVar2 = (this->source_map_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < iVar2) {
    iVar12 = 0;
    do {
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&(this->source_map_).super_RepeatedPtrFieldBase,iVar12);
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((pTVar7->_M_dataplus)._M_p,(int)pTVar7->_M_string_length,SERIALIZE,
                 "bloaty.Options.source_map");
      sVar4 = pTVar7->_M_string_length;
      if (((long)sVar4 < 0x80) && ((long)sVar4 <= (long)(stream->end_ + (0xe - (long)target)))) {
        *target = 'z';
        target[1] = (uint8)sVar4;
        memcpy(target + 2,(pTVar7->_M_dataplus)._M_p,sVar4);
        target = target + sVar4 + 2;
      }
      else {
        target = google::protobuf::io::EpsCopyOutputStream::WriteStringOutline
                           (stream,0xf,pTVar7,target);
      }
      iVar12 = iVar12 + 1;
    } while (iVar2 != iVar12);
  }
  pvVar6 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar6 & 1) != 0) {
    puVar13 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                        ((UnknownFieldSet *)((ulong)pvVar6 & 0xfffffffffffffffe),target,stream);
    return puVar13;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* Options::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:bloaty.Options)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string filename = 1;
  for (int i = 0, n = this->_internal_filename_size(); i < n; i++) {
    const auto& s = this->_internal_filename(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.filename");
    target = stream->WriteString(1, s, target);
  }

  // repeated string base_filename = 2;
  for (int i = 0, n = this->_internal_base_filename_size(); i < n; i++) {
    const auto& s = this->_internal_base_filename(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.base_filename");
    target = stream->WriteString(2, s, target);
  }

  // repeated string data_source = 3;
  for (int i = 0, n = this->_internal_data_source_size(); i < n; i++) {
    const auto& s = this->_internal_data_source(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.data_source");
    target = stream->WriteString(3, s, target);
  }

  cached_has_bits = _has_bits_[0];
  // optional int64 max_rows_per_level = 4 [default = 20];
  if (cached_has_bits & 0x00000100u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(4, this->_internal_max_rows_per_level(), target);
  }

  // optional .bloaty.Options.Demangle demangle = 5 [default = DEMANGLE_SHORT];
  if (cached_has_bits & 0x00000004u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      5, this->_internal_demangle(), target);
  }

  // optional .bloaty.Options.SortBy sort_by = 6 [default = SORTBY_BOTH];
  if (cached_has_bits & 0x00000008u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      6, this->_internal_sort_by(), target);
  }

  // optional int32 verbose_level = 7;
  if (cached_has_bits & 0x00000010u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(7, this->_internal_verbose_level(), target);
  }

  // repeated .bloaty.CustomDataSource custom_data_source = 8;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_custom_data_source_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(8, this->_internal_custom_data_source(i), target, stream);
  }

  // optional string disassemble_function = 9;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_disassemble_function().data(), static_cast<int>(this->_internal_disassemble_function().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.disassemble_function");
    target = stream->WriteStringMaybeAliased(
        9, this->_internal_disassemble_function(), target);
  }

  // repeated string debug_filename = 10;
  for (int i = 0, n = this->_internal_debug_filename_size(); i < n; i++) {
    const auto& s = this->_internal_debug_filename(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.debug_filename");
    target = stream->WriteString(10, s, target);
  }

  // optional uint64 debug_vmaddr = 11;
  if (cached_has_bits & 0x00000040u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(11, this->_internal_debug_vmaddr(), target);
  }

  // optional uint64 debug_fileoff = 12;
  if (cached_has_bits & 0x00000080u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(12, this->_internal_debug_fileoff(), target);
  }

  // optional string source_filter = 13;
  if (cached_has_bits & 0x00000002u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_source_filter().data(), static_cast<int>(this->_internal_source_filter().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.source_filter");
    target = stream->WriteStringMaybeAliased(
        13, this->_internal_source_filter(), target);
  }

  // optional bool dump_raw_map = 14;
  if (cached_has_bits & 0x00000020u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteBoolToArray(14, this->_internal_dump_raw_map(), target);
  }

  // repeated string source_map = 15;
  for (int i = 0, n = this->_internal_source_map_size(); i < n; i++) {
    const auto& s = this->_internal_source_map(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "bloaty.Options.source_map");
    target = stream->WriteString(15, s, target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:bloaty.Options)
  return target;
}